

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompareDump.cpp
# Opt level: O2

void __thiscall comparer_context::cmp<float>(comparer_context *this,size_t num,string *name)

{
  ostream *poVar1;
  size_t sVar2;
  stringstream ss;
  string sStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  for (sVar2 = 0; num != sVar2; sVar2 = sVar2 + 1) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar1 = std::operator<<(local_1a8,(string *)name);
    poVar1 = std::operator<<(poVar1,"[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"]");
    std::__cxx11::stringbuf::str();
    cmp<float>(this,&sStack_1d8);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return;
}

Assistant:

void cmp(size_t num,const std::string& name) {
        for(size_t n = 0; n < num; ++n) {
            std::stringstream ss;
            cmp<T>((ss<<name<<"["<<n<<"]",ss.str()));
    //      std::cout << name << " " << std::hex << a << std::endl;
        }
    }